

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O2

LogStream * __thiscall sznet::LogStream::operator<<(LogStream *this,void *p)

{
  char **ppcVar1;
  char *pcVar2;
  size_t sVar3;
  
  ppcVar1 = &(this->m_buffer).m_cur;
  pcVar2 = (this->m_buffer).m_cur;
  if (0x20 < (int)ppcVar1 - (int)pcVar2) {
    pcVar2[0] = '0';
    pcVar2[1] = 'x';
    sVar3 = detail::convertHex(pcVar2 + 2,(uintptr_t)p);
    *ppcVar1 = *ppcVar1 + sVar3;
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<<(const void* p)
{
	// convert to number
	uintptr_t i = reinterpret_cast<uintptr_t>(p);
	if (m_buffer.avail() > kMaxNumericSize)
	{
		char * buf = m_buffer.current();
		buf[0] = '0';
		buf[1] = 'x';
		size_t len = detail::convertHex(buf + 2, i);
		m_buffer.add(len);
	}
	return *this;
}